

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SWDAnalyzerSettings::SWDAnalyzerSettings(SWDAnalyzerSettings *this)

{
  SWDAnalyzerSettings *this_local;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__SWDAnalyzerSettings_00120d60;
  Channel::Channel(&this->mSWDIO,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  Channel::Channel(&this->mSWCLK,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mSWDIOInterface);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(&this->mSWCLKInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mSWDIOInterface,"SWDIO");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSWDIOInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)&this->mSWCLKInterface,"SWCLK");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)&this->mSWCLKInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddExportOption((uint)this,(char *)0x0);
  AnalyzerSettings::AddExportExtension((uint)this,(char *)0x0,"text");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWDIO,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSWCLK,true);
  return;
}

Assistant:

SWDAnalyzerSettings::SWDAnalyzerSettings() : mSWDIO( UNDEFINED_CHANNEL ), mSWCLK( UNDEFINED_CHANNEL )
{
    // init the interface
    mSWDIOInterface.SetTitleAndTooltip( "SWDIO", "SWDIO" );
    mSWDIOInterface.SetChannel( mSWDIO );

    mSWCLKInterface.SetTitleAndTooltip( "SWCLK", "SWCLK" );
    mSWCLKInterface.SetChannel( mSWCLK );

    // add the interface
    AddInterface( &mSWDIOInterface );
    AddInterface( &mSWCLKInterface );

    // describe export
    AddExportOption( 0, "Export as text file" );
    AddExportExtension( 0, "text", "txt" );

    ClearChannels();

    AddChannel( mSWDIO, "SWDIO", false );
    AddChannel( mSWCLK, "SWCLK", false );
}